

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_keypair_xonly_tweak_add
              (secp256k1_context *ctx,secp256k1_keypair *keypair,uchar *tweak32)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long in_RDX;
  void *in_RSI;
  secp256k1_context *in_RDI;
  int ret;
  int y_parity;
  secp256k1_scalar sk;
  secp256k1_ge pk;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  secp256k1_keypair *in_stack_ffffffffffffff78;
  secp256k1_ge *in_stack_ffffffffffffff80;
  secp256k1_scalar *in_stack_ffffffffffffff88;
  secp256k1_context *in_stack_ffffffffffffff90;
  uint local_4;
  
  if (in_RDI == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/main_impl.h"
            ,0x105,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_4 = 0;
  }
  else {
    uVar1 = secp256k1_keypair_load
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80
                       ,in_stack_ffffffffffffff78);
    memset(in_RSI,0,0x60);
    iVar2 = secp256k1_extrakeys_ge_even_y
                      ((secp256k1_ge *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                      );
    if (iVar2 == 1) {
      secp256k1_scalar_negate
                ((secp256k1_scalar *)CONCAT44(in_stack_ffffffffffffff74,1),
                 (secp256k1_scalar *)CONCAT44(uVar1,in_stack_ffffffffffffff68));
    }
    uVar3 = secp256k1_ec_seckey_tweak_add_helper
                      ((secp256k1_scalar *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78->data
                      );
    uVar3 = uVar3 & uVar1;
    local_4 = secp256k1_ec_pubkey_tweak_add_helper
                        (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78->data);
    local_4 = local_4 & uVar3;
    secp256k1_declassify(in_RDI,&stack0xffffffffffffff6c,4);
    if (local_4 != 0) {
      secp256k1_keypair_save
                ((secp256k1_keypair *)CONCAT44(in_stack_ffffffffffffff74,iVar2),
                 (secp256k1_scalar *)CONCAT44(local_4,in_stack_ffffffffffffff68),
                 (secp256k1_ge *)0x108038);
    }
    secp256k1_scalar_clear((secp256k1_scalar *)0x108042);
  }
  return local_4;
}

Assistant:

int secp256k1_keypair_xonly_tweak_add(const secp256k1_context* ctx, secp256k1_keypair *keypair, const unsigned char *tweak32) {
    secp256k1_ge pk;
    secp256k1_scalar sk;
    int y_parity;
    int ret;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(keypair != NULL);
    ARG_CHECK(tweak32 != NULL);

    ret = secp256k1_keypair_load(ctx, &sk, &pk, keypair);
    memset(keypair, 0, sizeof(*keypair));

    y_parity = secp256k1_extrakeys_ge_even_y(&pk);
    if (y_parity == 1) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    ret &= secp256k1_ec_seckey_tweak_add_helper(&sk, tweak32);
    ret &= secp256k1_ec_pubkey_tweak_add_helper(&pk, tweak32);

    secp256k1_declassify(ctx, &ret, sizeof(ret));
    if (ret) {
        secp256k1_keypair_save(keypair, &sk, &pk);
    }

    secp256k1_scalar_clear(&sk);
    return ret;
}